

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O0

CharContent * __thiscall
CGI::make_environment
          (CharContent *__return_storage_ptr__,CGI *this,Request *request,CharContent *cgi_key)

{
  bool bVar1;
  uint16_t uVar2;
  size_t pos_00;
  size_t sVar3;
  _func_int **pp_Var4;
  mapped_type *pmVar5;
  CharContent local_428;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_400;
  CharContent local_3f8;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_3d0;
  byte local_3c1;
  CharContent local_3c0;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_398;
  CharContent local_390;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_368;
  byte local_359;
  CharContent local_358;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_330;
  CharContent local_328;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_300;
  byte local_2f1;
  CharContent local_2f0;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_2c8;
  CharContent local_2c0;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_298;
  undefined1 local_290;
  char local_28f [7];
  char local_288;
  char server_port [7];
  char server_ip_1 [21];
  uint16_t local_26a;
  socklen_t local_sock_len_1;
  sockaddr_in local_sock_1;
  char server_ip [21];
  socklen_t local_sock_len;
  sockaddr_in local_sock;
  char client_ip_1 [21];
  socklen_t remote_sock_len_1;
  sockaddr_in remote_sock_1;
  char client_ip [21];
  socklen_t local_1d4;
  undefined1 local_1d0 [4];
  socklen_t remote_sock_len;
  sockaddr_in remote_sock;
  size_t pos_1;
  CharContent path_1;
  CharContent local_160;
  _func_int **local_138;
  size_t pos;
  CharContent path;
  CharContent local_100;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_d8;
  CharContent local_d0;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_a8;
  byte local_99;
  CharContent local_98;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_70 [3];
  CharContent local_58;
  _Node_iterator_base<std::pair<const_CharContent,_CharContent>,_true> local_30;
  CharContent *local_28;
  CharContent *cgi_key_local;
  Request *request_local;
  CGI *this_local;
  CharContent *temp;
  
  local_28 = cgi_key;
  cgi_key_local = &request->method;
  request_local = (Request *)this;
  this_local = (CGI *)__return_storage_ptr__;
  bVar1 = operator==(cgi_key,"REQUEST_METHOD");
  if (bVar1) {
    CharContent::CharContent(__return_storage_ptr__,&request->method);
  }
  else {
    bVar1 = operator==(cgi_key,"CONTENT_TYPE");
    if (bVar1) {
      CharContent::CharContent(&local_58,"Content-Type");
      local_99 = 0;
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
           ::find(&request->headers,&local_58);
      local_70[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
           ::end(&request->headers);
      bVar1 = std::__detail::operator!=(&local_30,local_70);
      if (bVar1) {
        CharContent::CharContent(&local_98,"Content-Type");
        local_99 = 1;
        pmVar5 = std::
                 unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                 ::operator[](&request->headers,&local_98);
        CharContent::CharContent(__return_storage_ptr__,pmVar5);
      }
      else {
        CharContent::CharContent(__return_storage_ptr__,"");
      }
      if ((local_99 & 1) != 0) {
        CharContent::~CharContent(&local_98);
      }
      CharContent::~CharContent(&local_58);
    }
    else {
      bVar1 = operator==(cgi_key,"CONTENT_LENGTH");
      if (bVar1) {
        CharContent::CharContent(&local_d0,"Content-Length");
        path.m_length._7_1_ = 0;
        local_a8._M_cur =
             (__node_type *)
             std::
             unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
             ::find(&request->headers,&local_d0);
        local_d8._M_cur =
             (__node_type *)
             std::
             unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
             ::end(&request->headers);
        bVar1 = std::__detail::operator!=(&local_a8,&local_d8);
        if (bVar1) {
          CharContent::CharContent(&local_100,"Content-Length");
          path.m_length._7_1_ = 1;
          pmVar5 = std::
                   unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                   ::operator[](&request->headers,&local_100);
          CharContent::CharContent(__return_storage_ptr__,pmVar5);
        }
        else {
          CharContent::CharContent(__return_storage_ptr__,"");
        }
        if ((path.m_length._7_1_ & 1) != 0) {
          CharContent::~CharContent(&local_100);
        }
        CharContent::~CharContent(&local_d0);
      }
      else {
        bVar1 = operator==(cgi_key,"QUERY_STRING");
        if (bVar1) {
          CharContent::CharContent((CharContent *)&pos,&request->uri);
          local_138 = (_func_int **)0x0;
          CharContent::CharContent(&local_160,"?");
          pp_Var4 = (_func_int **)CharContent::find((CharContent *)&pos,&local_160,0);
          local_138 = pp_Var4;
          CharContent::~CharContent(&local_160);
          if (pp_Var4 == path._vptr_CharContent) {
            CharContent::CharContent(__return_storage_ptr__,"");
          }
          else {
            pos_00 = (long)local_138 + 1;
            sVar3 = CharContent::length((CharContent *)&pos);
            CharContent::subCharContent
                      (__return_storage_ptr__,(CharContent *)&pos,pos_00,~(ulong)local_138 + sVar3);
          }
          path_1.m_length._4_4_ = 1;
          CharContent::~CharContent((CharContent *)&pos);
        }
        else {
          bVar1 = operator==(cgi_key,"SCRIPT_NAME");
          if (bVar1) {
            CharContent::CharContent((CharContent *)&pos_1,&request->uri);
            CharContent::CharContent((CharContent *)remote_sock.sin_zero,"?");
            pp_Var4 = (_func_int **)
                      CharContent::find((CharContent *)&pos_1,(CharContent *)remote_sock.sin_zero,0)
            ;
            CharContent::~CharContent((CharContent *)remote_sock.sin_zero);
            if (pp_Var4 == path_1._vptr_CharContent) {
              CharContent::CharContent(__return_storage_ptr__,(CharContent *)&pos_1);
            }
            else {
              CharContent::subCharContent
                        (__return_storage_ptr__,(CharContent *)&pos_1,0,(size_t)pp_Var4);
            }
            path_1.m_length._4_4_ = 1;
            CharContent::~CharContent((CharContent *)&pos_1);
          }
          else {
            bVar1 = operator==(cgi_key,"PATH_INFO");
            if (bVar1) {
              CharContent::CharContent(__return_storage_ptr__,&this->_name);
            }
            else {
              bVar1 = operator==(cgi_key,"PATH_TRANSLATED");
              if (bVar1) {
                CharContent::CharContent(__return_storage_ptr__,&this->_path);
              }
              else {
                bVar1 = operator==(cgi_key,"REMOTE_ADDR");
                if (bVar1) {
                  local_1d4 = 0x10;
                  getpeername(this->_connfd,(sockaddr *)local_1d0,&local_1d4);
                  memset(remote_sock_1.sin_zero + 4,0,0x15);
                  inet_ntop(2,&remote_sock_len,(char *)(remote_sock_1.sin_zero + 4),0x15);
                  remote_sock_1.sin_zero[3] = '\0';
                  CharContent::CharContent
                            (__return_storage_ptr__,(char *)(remote_sock_1.sin_zero + 4));
                }
                else {
                  bVar1 = operator==(cgi_key,"REMOTE_HOST");
                  if (bVar1) {
                    client_ip_1[0x10] = '\x10';
                    client_ip_1[0x11] = '\0';
                    client_ip_1[0x12] = '\0';
                    client_ip_1[0x13] = '\0';
                    getpeername(this->_connfd,(sockaddr *)(client_ip_1 + 0x14),
                                (socklen_t *)(client_ip_1 + 0x10));
                    memset(local_sock.sin_zero + 4,0,0x15);
                    inet_ntop(2,&remote_sock_len_1,(char *)(local_sock.sin_zero + 4),0x15);
                    local_sock.sin_zero[3] = '\0';
                    CharContent::CharContent
                              (__return_storage_ptr__,(char *)(local_sock.sin_zero + 4));
                  }
                  else {
                    bVar1 = operator==(cgi_key,"GATEWAY_INTERFACE");
                    if (bVar1) {
                      CharContent::CharContent(__return_storage_ptr__,"CGI/1.1");
                    }
                    else {
                      bVar1 = operator==(cgi_key,"SERVER_NAME");
                      if (bVar1) {
                        server_ip[0x10] = '\x10';
                        server_ip[0x11] = '\0';
                        server_ip[0x12] = '\0';
                        server_ip[0x13] = '\0';
                        getsockname(this->_connfd,(sockaddr *)(server_ip + 0x14),
                                    (socklen_t *)(server_ip + 0x10));
                        memset(local_sock_1.sin_zero + 4,0,0x15);
                        inet_ntop(2,&local_sock_len,(char *)(local_sock_1.sin_zero + 4),0x15);
                        local_sock_1.sin_zero[3] = '\0';
                        CharContent::CharContent
                                  (__return_storage_ptr__,(char *)(local_sock_1.sin_zero + 4));
                      }
                      else {
                        bVar1 = operator==(cgi_key,"SERVER_PORT");
                        if (bVar1) {
                          server_ip_1[0x10] = '\x10';
                          server_ip_1[0x11] = '\0';
                          server_ip_1[0x12] = '\0';
                          server_ip_1[0x13] = '\0';
                          getsockname(this->_connfd,(sockaddr *)(server_ip_1 + 0x14),
                                      (socklen_t *)(server_ip_1 + 0x10));
                          memset(&local_288,0,0x15);
                          inet_ntop(2,&local_sock_len_1,&local_288,0x15);
                          memset(local_28f,0,7);
                          uVar2 = ntohs(local_26a);
                          snprintf(local_28f,7,"%d",(ulong)uVar2);
                          local_290 = 0;
                          CharContent::CharContent(__return_storage_ptr__,local_28f);
                        }
                        else {
                          bVar1 = operator==(cgi_key,"SERVER_PROTOCOL");
                          if (bVar1) {
                            CharContent::CharContent(__return_storage_ptr__,"HTTP/1.1");
                          }
                          else {
                            bVar1 = operator==(cgi_key,"HTTP_ACCEPT");
                            if (bVar1) {
                              CharContent::CharContent(&local_2c0,"Content-Type");
                              local_2f1 = 0;
                              local_298._M_cur =
                                   (__node_type *)
                                   std::
                                   unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                   ::find(&request->headers,&local_2c0);
                              local_2c8._M_cur =
                                   (__node_type *)
                                   std::
                                   unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                   ::end(&request->headers);
                              bVar1 = std::__detail::operator!=(&local_298,&local_2c8);
                              if (bVar1) {
                                CharContent::CharContent(&local_2f0,"Content-Type");
                                local_2f1 = 1;
                                pmVar5 = std::
                                         unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                         ::operator[](&request->headers,&local_2f0);
                                CharContent::CharContent(__return_storage_ptr__,pmVar5);
                              }
                              else {
                                CharContent::CharContent(__return_storage_ptr__,"");
                              }
                              if ((local_2f1 & 1) != 0) {
                                CharContent::~CharContent(&local_2f0);
                              }
                              CharContent::~CharContent(&local_2c0);
                            }
                            else {
                              bVar1 = operator==(cgi_key,"HTTP_USER_AGENT");
                              if (bVar1) {
                                CharContent::CharContent(&local_328,"User-Agent");
                                local_359 = 0;
                                local_300._M_cur =
                                     (__node_type *)
                                     std::
                                     unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                     ::find(&request->headers,&local_328);
                                local_330._M_cur =
                                     (__node_type *)
                                     std::
                                     unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                     ::end(&request->headers);
                                bVar1 = std::__detail::operator!=(&local_300,&local_330);
                                if (bVar1) {
                                  CharContent::CharContent(&local_358,"User-Agent");
                                  local_359 = 1;
                                  pmVar5 = std::
                                           unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                           ::operator[](&request->headers,&local_358);
                                  CharContent::CharContent(__return_storage_ptr__,pmVar5);
                                }
                                else {
                                  CharContent::CharContent(__return_storage_ptr__,"");
                                }
                                if ((local_359 & 1) != 0) {
                                  CharContent::~CharContent(&local_358);
                                }
                                CharContent::~CharContent(&local_328);
                              }
                              else {
                                bVar1 = operator==(cgi_key,"HTTP_REFERER");
                                if (bVar1) {
                                  CharContent::CharContent(&local_390,"Referer");
                                  local_3c1 = 0;
                                  local_368._M_cur =
                                       (__node_type *)
                                       std::
                                       unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                       ::find(&request->headers,&local_390);
                                  local_398._M_cur =
                                       (__node_type *)
                                       std::
                                       unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                       ::end(&request->headers);
                                  bVar1 = std::__detail::operator!=(&local_368,&local_398);
                                  if (bVar1) {
                                    CharContent::CharContent(&local_3c0,"Referer");
                                    local_3c1 = 1;
                                    pmVar5 = std::
                                             unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                             ::operator[](&request->headers,&local_3c0);
                                    CharContent::CharContent(__return_storage_ptr__,pmVar5);
                                  }
                                  else {
                                    CharContent::CharContent(__return_storage_ptr__,"");
                                  }
                                  if ((local_3c1 & 1) != 0) {
                                    CharContent::~CharContent(&local_3c0);
                                  }
                                  CharContent::~CharContent(&local_390);
                                }
                                else {
                                  bVar1 = operator==(cgi_key,"HTTP_COOKIE");
                                  if (bVar1) {
                                    CharContent::CharContent(&local_3f8,"Cookie");
                                    local_3d0._M_cur =
                                         (__node_type *)
                                         std::
                                         unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                         ::find(&request->headers,&local_3f8);
                                    local_400._M_cur =
                                         (__node_type *)
                                         std::
                                         unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                         ::end(&request->headers);
                                    bVar1 = std::__detail::operator!=(&local_3d0,&local_400);
                                    if (bVar1) {
                                      CharContent::CharContent(&local_428,"Cookie");
                                      pmVar5 = std::
                                               unordered_map<CharContent,_CharContent,_hashFunc,_EqualFunc,_std::allocator<std::pair<const_CharContent,_CharContent>_>_>
                                               ::operator[](&request->headers,&local_428);
                                      CharContent::CharContent(__return_storage_ptr__,pmVar5);
                                      CharContent::~CharContent(&local_428);
                                    }
                                    else {
                                      CharContent::CharContent(__return_storage_ptr__,"");
                                    }
                                    CharContent::~CharContent(&local_3f8);
                                  }
                                  else {
                                    CharContent::CharContent(__return_storage_ptr__,"");
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CharContent CGI::make_environment(Request request,CharContent cgi_key){
	//to do
	if(cgi_key=="REQUEST_METHOD"){
		return request.method;
	}else if(cgi_key=="CONTENT_TYPE"){
		return request.headers.find("Content-Type")!=request.headers.end()?request.headers["Content-Type"]:"";
	}else if(cgi_key=="CONTENT_LENGTH"){
		return request.headers.find("Content-Length")!=request.headers.end()?request.headers["Content-Length"]:"";
	}else if(cgi_key=="QUERY_STRING"){
		CharContent path=request.uri;
		size_t pos=0;
		if((pos=path.find("?"))==path.npos){
			return "";
		}
		return path.subCharContent(pos+1,path.length()-pos-1);
	}else if(cgi_key=="SCRIPT_NAME"){
		CharContent path=request.uri;
		size_t pos=0;
		if((pos=path.find("?"))==path.npos){
			return path;
		}
		return path.subCharContent(0,pos);
	}else if(cgi_key=="PATH_INFO"){
		return this->_name;
	}else if(cgi_key=="PATH_TRANSLATED"){
		return this->_path;
	}else if(cgi_key=="REMOTE_ADDR"){
		//发送此次请求的主机IP
		sockaddr_in remote_sock;
		socklen_t remote_sock_len=sizeof(remote_sock);
		getpeername(_connfd,(sockaddr *)&remote_sock,&remote_sock_len);
		char client_ip[21]={'\0'};
		inet_ntop(AF_INET, &remote_sock.sin_addr, client_ip, sizeof(client_ip));
		CharContent temp(client_ip);
		return temp;
	}else if(cgi_key=="REMOTE_HOST"){
		//发送此次请求的主机名
		sockaddr_in remote_sock;
		socklen_t remote_sock_len=sizeof(remote_sock);
		getpeername(_connfd,(sockaddr *)&remote_sock,&remote_sock_len);
		char client_ip[21]={'\0'};
		inet_ntop(AF_INET, &remote_sock.sin_addr, client_ip, sizeof(client_ip));
		CharContent temp(client_ip);
		return temp;
	}else if(cgi_key=="GATEWAY_INTERFACE"){
		return CharContent("CGI/1.1");
	}else if(cgi_key=="SERVER_NAME"){
		//服务器主机名、域名或IP
		sockaddr_in local_sock;
		socklen_t local_sock_len=sizeof(local_sock);
		getsockname(_connfd,(sockaddr *)&local_sock,&local_sock_len);
		char server_ip[21]={'\0'};
		inet_ntop(AF_INET, &local_sock.sin_addr, server_ip, sizeof(server_ip));
		CharContent temp(server_ip);
		return temp;
	}else if(cgi_key=="SERVER_PORT"){
		//服务器端口号
		sockaddr_in local_sock;
		socklen_t local_sock_len=sizeof(local_sock);
		getsockname(_connfd,(sockaddr *)&local_sock,&local_sock_len);
		char server_ip[21]={'\0'};
		inet_ntop(AF_INET, &local_sock.sin_addr, server_ip, sizeof(server_ip));
		char server_port[7]={'\0'};
		snprintf(server_port,sizeof(server_port),"%d",ntohs(local_sock.sin_port));
		CharContent temp(server_port);
		return temp;
	}else if(cgi_key=="SERVER_PROTOCOL"){
		return CharContent("HTTP/1.1");
	}else if(cgi_key=="HTTP_ACCEPT"){
		return request.headers.find("Content-Type")!=request.headers.end()?request.headers["Content-Type"]:"";
	}else if(cgi_key=="HTTP_USER_AGENT"){
		return request.headers.find("User-Agent")!=request.headers.end()?request.headers["User-Agent"]:"";
	}else if(cgi_key=="HTTP_REFERER"){
		return request.headers.find("Referer")!=request.headers.end()?request.headers["Referer"]:"";
	}else if(cgi_key=="HTTP_COOKIE"){
		return request.headers.find("Cookie")!=request.headers.end()?request.headers["Cookie"]:"";
	}
	return CharContent("");
}